

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

double3 * tinyusdz::transform(double3 *__return_storage_ptr__,matrix4d *m,double3 *p)

{
  array<double,_3UL> *in_RCX;
  array<double,_3UL> local_48;
  undefined1 local_30 [8];
  double3 tx;
  double3 *p_local;
  matrix4d *m_local;
  
  local_30 = (undefined1  [8])m->m[3][0];
  tx._M_elems[0] = m->m[3][1];
  tx._M_elems[1] = m->m[3][2];
  tx._M_elems[2] = (double)p;
  value::MultV<tinyusdz::value::matrix4d,std::array<double,3ul>,double,double,3ul>
            (&local_48,(value *)m,(matrix4d *)p,in_RCX);
  operator+(__return_storage_ptr__,&local_48,(double3 *)local_30);
  return __return_storage_ptr__;
}

Assistant:

value::double3 transform(const value::matrix4d &m, const value::double3 &p) {
  value::double3 tx{m.m[3][0], m.m[3][1], m.m[3][2]};
  return value::MultV<value::matrix4d, value::double3, double, double, 3>(m, p) + tx;
}